

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeH1.cpp
# Opt level: O3

void TPZShapeH1<pzshape::TPZShapeLinear>::Initialize
               (TPZVec<long> *ids,TPZVec<int> *connectorders,TPZShapeData *data)

{
  int *piVar1;
  ulong uVar2;
  long *plVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  TPZManVector<int,_27> local_b8;
  
  if ((ids->fNElements != 2) || (connectorders->fNElements != 1)) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeH1.cpp"
               ,0x15);
  }
  local_b8.super_TPZVec<int>.fStore = local_b8.fExtAlloc;
  local_b8.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018896a0;
  local_b8.super_TPZVec<int>.fNElements = 1;
  local_b8.super_TPZVec<int>.fNAlloc = 0;
  piVar1 = connectorders->fStore;
  lVar5 = 0;
  do {
    local_b8.super_TPZVec<int>.fStore[lVar5] = piVar1[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 1);
  TPZManVector<int,_27>::operator=(&data->fH1ConnectOrders,&local_b8);
  piVar1 = local_b8.fExtAlloc;
  if (local_b8.super_TPZVec<int>.fStore == piVar1) {
    local_b8.super_TPZVec<int>.fStore = (int *)0x0;
  }
  else {
    local_b8.super_TPZVec<int>.fNAlloc = 0;
    local_b8.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
    if (local_b8.super_TPZVec<int>.fStore != (int *)0x0) {
      operator_delete__(local_b8.super_TPZVec<int>.fStore);
    }
  }
  ComputeTransforms<pzshape::TPZShapeLinear>
            (ids,&(data->fSideTransforms).super_TPZVec<TPZTransform<double>_>);
  local_b8.super_TPZVec<int>.fStore = (int *)0x0;
  local_b8.super_TPZVec<int>.fNElements = 0;
  local_b8.super_TPZVec<int>.fNAlloc = 0;
  local_b8.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018b7200;
  uVar2 = ids->fNElements;
  if ((long)uVar2 < 9) {
    local_b8.super_TPZVec<int>.fStore = piVar1;
    if ((long)uVar2 < 1) goto LAB_00ff8e53;
  }
  else {
    local_b8.super_TPZVec<int>.fStore =
         (int *)operator_new__(-(ulong)(uVar2 >> 0x3d != 0) | uVar2 * 8);
    local_b8.super_TPZVec<int>.fNAlloc = uVar2;
  }
  plVar3 = ids->fStore;
  uVar6 = 0;
  do {
    *(long *)(local_b8.super_TPZVec<int>.fStore + uVar6 * 2) = plVar3[uVar6];
    uVar6 = uVar6 + 1;
  } while (uVar2 != uVar6);
LAB_00ff8e53:
  local_b8.super_TPZVec<int>.fNElements = uVar2;
  TPZManVector<long,_8>::operator=(&data->fCornerNodeIds,(TPZManVector<long,_8> *)&local_b8);
  if (local_b8.super_TPZVec<int>.fStore != piVar1) {
    local_b8.super_TPZVec<int>.fNAlloc = 0;
    local_b8.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
    if (local_b8.super_TPZVec<int>.fStore != (int *)0x0) {
      operator_delete__(local_b8.super_TPZVec<int>.fStore);
    }
  }
  (*(data->fH1NumConnectShape).super_TPZVec<int>._vptr_TPZVec[3])(&data->fH1NumConnectShape,1);
  iVar4 = pzshape::TPZShapeLinear::NConnectShapeF(2,*connectorders->fStore);
  *(data->fH1NumConnectShape).super_TPZVec<int>.fStore = iVar4;
  TPZFMatrix<double>::Resize(&(data->fPhi).super_TPZFMatrix<double>,(long)iVar4 + 2,1);
  TPZFMatrix<double>::Resize(&(data->fDPhi).super_TPZFMatrix<double>,1,(long)iVar4 + 2);
  return;
}

Assistant:

void TPZShapeH1<TSHAPE>::Initialize(const TPZVec<int64_t> &ids,
                                           const TPZVec<int> &connectorders,
                                           TPZShapeData &data) {
    const int ncorner = TSHAPE::NCornerNodes;
    const int nsides = TSHAPE::NSides;
    if((ids.size() != ncorner || connectorders.size() != nsides-ncorner) && TSHAPE::Type() != EPoint)
    {
        DebugStop();
    }
    data.fH1ConnectOrders = connectorders;
    ComputeTransforms<TSHAPE>(ids, data.fSideTransforms);
    data.fCornerNodeIds = ids;
    data.fH1NumConnectShape.resize(TSHAPE::NSides-TSHAPE::NCornerNodes);
    int64_t nshape = TSHAPE::NCornerNodes;
    for(int i = TSHAPE::NCornerNodes; i < TSHAPE::NSides; i++)
    {
        int nshapeconnect = TSHAPE::NConnectShapeF(i,connectorders[i-TSHAPE::NCornerNodes]);
        data.fH1NumConnectShape[i-TSHAPE::NCornerNodes] = nshapeconnect;
        nshape += nshapeconnect;
    }
    data.fPhi.Resize(nshape,1);
    data.fDPhi.Resize(TSHAPE::Dimension, nshape);
//    fNodeIds = ids; Should we make it an attribute of the class?
}